

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

size_t helics::detail::convertToBinary(byte *data,double *val,size_t size)

{
  size_t sVar1;
  
  data[0] = 0x6c;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  data[4] = (byte)(size >> 0x18);
  data[5] = (byte)(size >> 0x10);
  data[6] = (byte)(size >> 8);
  data[7] = (byte)size;
  if (size == 0) {
    sVar1 = 8;
  }
  else {
    memcpy(data + 8,val,size * 8);
    sVar1 = size * 8 + 8;
  }
  return sVar1;
}

Assistant:

size_t convertToBinary(std::byte* data, const double* val, size_t size)
{
    addCodeAndSize(data, vectorCode, size);
    if (size > 0) {
        std::memcpy(data + 8, val, size * sizeof(double));
    }
    return size * sizeof(double) + 8U;
}